

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgncl(fitsfile *fptr,int *ncols,int *status)

{
  int iVar1;
  int *in_RDX;
  undefined4 *in_RSI;
  int *in_RDI;
  int *in_stack_00000040;
  int *in_stack_00000048;
  int in_stack_00000054;
  fitsfile *in_stack_00000058;
  int *in_stack_000000e0;
  fitsfile *in_stack_000000e8;
  int local_4;
  
  if (*in_RDX < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_000000e8,in_stack_000000e0), 0 < iVar1)) {
        return *in_RDX;
      }
    }
    else {
      ffmahd(in_stack_00000058,in_stack_00000054,in_stack_00000048,in_stack_00000040);
    }
    if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
      *in_RDX = 0xeb;
      local_4 = 0xeb;
    }
    else {
      *in_RSI = *(undefined4 *)(*(long *)(in_RDI + 2) + 0x3b0);
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffgncl( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  *ncols,     /* O - number of columns in the table          */
            int  *status)    /* IO - error status                           */
/*
  Get the number of columns in the table (= TFIELDS keyword)
*/
{
    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
        return(*status = NOT_TABLE);

    *ncols = (fptr->Fptr)->tfield;

    return(*status);
}